

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O1

int dds_test(stbi *s)

{
  int iVar1;
  uint32 uVar2;
  uint uVar3;
  
  iVar1 = get8(s);
  uVar3 = 0;
  if (iVar1 == 0x44) {
    iVar1 = get8(s);
    if (iVar1 == 0x44) {
      iVar1 = get8(s);
      if (iVar1 == 0x53) {
        iVar1 = get8(s);
        uVar3 = 0;
        if (iVar1 == 0x20) {
          uVar2 = get32le(s);
          uVar3 = (uint)(uVar2 == 0x7c);
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static int dds_test(stbi *s)
{
	//	check the magic number
	if (get8(s) != 'D') return 0;
	if (get8(s) != 'D') return 0;
	if (get8(s) != 'S') return 0;
	if (get8(s) != ' ') return 0;
	//	check header size
	if (get32le(s) != 124) return 0;
	return 1;
}